

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mapinfo.cpp
# Opt level: O0

void __thiscall
FMapInfoParser::ParseMapInfo
          (FMapInfoParser *this,int lump,level_info_t *gamedefaults,level_info_t *defaultinfo)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  level_info_t *info;
  level_info_t *levelinfo;
  undefined1 local_130 [8];
  FScanner saved_sc;
  int inclump;
  level_info_t *defaultinfo_local;
  level_info_t *gamedefaults_local;
  int lump_local;
  FMapInfoParser *this_local;
  
  FScanner::OpenLumpNum(&this->sc,lump);
  level_info_t::operator=(defaultinfo,gamedefaults);
  this->HexenHack = false;
  while (bVar1 = FScanner::GetString(&this->sc), bVar1) {
    bVar1 = FScanner::Compare(&this->sc,"include");
    if (bVar1) {
      FScanner::MustGetString(&this->sc);
      saved_sc._252_4_ = FWadCollection::CheckNumForFullName(&Wads,(this->sc).String,true,0);
      if ((int)saved_sc._252_4_ < 0) {
        FScanner::ScriptError(&this->sc,"include file \'%s\' not found",(this->sc).String);
      }
      iVar3 = FWadCollection::GetLumpFile(&Wads,(this->sc).LumpNum);
      iVar2 = FWadCollection::GetLumpFile(&Wads,saved_sc._252_4_);
      if ((iVar3 != iVar2) &&
         (iVar3 = FWadCollection::GetLumpFile(&Wads,(this->sc).LumpNum), iVar3 == 0)) {
        iVar3 = FWadCollection::GetLumpFile(&Wads,saved_sc._252_4_);
        pcVar4 = FWadCollection::GetWadFullName(&Wads,iVar3);
        I_FatalError("File %s is overriding core lump %s.",pcVar4,(this->sc).String);
      }
      FScanner::FScanner((FScanner *)local_130,&this->sc);
      ParseMapInfo(this,saved_sc._252_4_,gamedefaults,defaultinfo);
      FScanner::operator=(&this->sc,(FScanner *)local_130);
      FScanner::~FScanner((FScanner *)local_130);
    }
    else {
      bVar1 = FScanner::Compare(&this->sc,"gamedefaults");
      if (bVar1) {
        level_info_t::Reset(gamedefaults);
        ParseMapDefinition(this,gamedefaults);
        level_info_t::operator=(defaultinfo,gamedefaults);
      }
      else {
        bVar1 = FScanner::Compare(&this->sc,"defaultmap");
        if (bVar1) {
          level_info_t::operator=(defaultinfo,gamedefaults);
          ParseMapDefinition(this,defaultinfo);
        }
        else {
          bVar1 = FScanner::Compare(&this->sc,"adddefaultmap");
          if (bVar1) {
            ParseMapDefinition(this,defaultinfo);
          }
          else {
            bVar1 = FScanner::Compare(&this->sc,"map");
            if (bVar1) {
              info = ParseMapHeader(this,defaultinfo);
              ParseMapDefinition(this,info);
              iVar3 = FString::CompareNoCase(&info->SkyPic2,"-NOFLAT-");
              if (iVar3 == 0) {
                FString::operator=(&info->SkyPic2,&info->SkyPic1);
              }
              SetLevelNum(info,info->levelnum);
            }
            else {
              bVar1 = FScanner::Compare(&this->sc,"clusterdef");
              if ((bVar1) ||
                 ((this->format_type != 1 && (bVar1 = FScanner::Compare(&this->sc,"cluster"), bVar1)
                  ))) {
                ParseCluster(this);
              }
              else {
                bVar1 = FScanner::Compare(&this->sc,"episode");
                if (bVar1) {
                  ParseEpisodeInfo(this);
                }
                else {
                  bVar1 = FScanner::Compare(&this->sc,"clearepisodes");
                  if (bVar1) {
                    ClearEpisodes();
                  }
                  else {
                    bVar1 = FScanner::Compare(&this->sc,"skill");
                    if (bVar1) {
                      ParseSkill(this);
                    }
                    else {
                      bVar1 = FScanner::Compare(&this->sc,"clearskills");
                      if (bVar1) {
                        TArray<FSkillInfo,_FSkillInfo>::Clear(&AllSkills);
                        DefaultSkill = -1;
                      }
                      else {
                        bVar1 = FScanner::Compare(&this->sc,"gameinfo");
                        if (bVar1) {
                          if (this->format_type == 1) {
                            FScanner::ScriptError
                                      (&this->sc,
                                       "gameinfo definitions not supported with old MAPINFO syntax")
                            ;
                          }
                          else {
                            this->format_type = 2;
                            ParseGameInfo(this);
                          }
                        }
                        else {
                          bVar1 = FScanner::Compare(&this->sc,"intermission");
                          if (bVar1) {
                            if (this->format_type == 1) {
                              FScanner::ScriptError
                                        (&this->sc,
                                         "intermission definitions not supported with old MAPINFO syntax"
                                        );
                            }
                            else {
                              this->format_type = 2;
                              ParseIntermission(this);
                            }
                          }
                          else {
                            bVar1 = FScanner::Compare(&this->sc,"doomednums");
                            if (bVar1) {
                              if (this->format_type == 1) {
                                FScanner::ScriptError
                                          (&this->sc,
                                           "doomednums definitions not supported with old MAPINFO syntax"
                                          );
                              }
                              else {
                                this->format_type = 2;
                                ParseDoomEdNums(this);
                              }
                            }
                            else {
                              bVar1 = FScanner::Compare(&this->sc,"spawnnums");
                              if (bVar1) {
                                if (this->format_type == 1) {
                                  FScanner::ScriptError
                                            (&this->sc,
                                             "spawnnums definitions not supported with old MAPINFO syntax"
                                            );
                                }
                                else {
                                  this->format_type = 2;
                                  ParseSpawnNums(this);
                                }
                              }
                              else {
                                bVar1 = FScanner::Compare(&this->sc,"conversationids");
                                if (bVar1) {
                                  if (this->format_type == 1) {
                                    FScanner::ScriptError
                                              (&this->sc,
                                               "conversationids definitions not supported with old MAPINFO syntax"
                                              );
                                  }
                                  else {
                                    this->format_type = 2;
                                    ParseConversationIDs(this);
                                  }
                                }
                                else {
                                  bVar1 = FScanner::Compare(&this->sc,"automap");
                                  if ((bVar1) ||
                                     (bVar1 = FScanner::Compare(&this->sc,"automap_overlay"), bVar1)
                                     ) {
                                    if (this->format_type == 1) {
                                      FScanner::ScriptError
                                                (&this->sc,
                                                 "automap colorset definitions not supported with old MAPINFO syntax"
                                                );
                                    }
                                    else {
                                      this->format_type = 2;
                                      bVar1 = FScanner::Compare(&this->sc,"automap_overlay");
                                      ParseAMColors(this,bVar1);
                                    }
                                  }
                                  else {
                                    FScanner::ScriptError
                                              (&this->sc,"%s: Unknown top level keyword",
                                               (this->sc).String);
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void FMapInfoParser::ParseMapInfo (int lump, level_info_t &gamedefaults, level_info_t &defaultinfo)
{
	sc.OpenLumpNum(lump);

	defaultinfo = gamedefaults;
	HexenHack = false;

	while (sc.GetString ())
	{
		if (sc.Compare("include"))
		{
			sc.MustGetString();
			int inclump = Wads.CheckNumForFullName(sc.String, true);
			if (inclump < 0)
			{
				sc.ScriptError("include file '%s' not found", sc.String);
			}
			if (Wads.GetLumpFile(sc.LumpNum) != Wads.GetLumpFile(inclump))
			{
				// Do not allow overriding includes from the default MAPINFO
				if (Wads.GetLumpFile(sc.LumpNum) == 0)
				{
					I_FatalError("File %s is overriding core lump %s.",
						Wads.GetWadFullName(Wads.GetLumpFile(inclump)), sc.String);
				}
			}
			FScanner saved_sc = sc;
			ParseMapInfo(inclump, gamedefaults, defaultinfo);
			sc = saved_sc;
		}
		else if (sc.Compare("gamedefaults"))
		{
			gamedefaults.Reset();
			ParseMapDefinition(gamedefaults);
			defaultinfo = gamedefaults;
		}
		else if (sc.Compare("defaultmap"))
		{
			defaultinfo = gamedefaults;
			ParseMapDefinition(defaultinfo);
		}
		else if (sc.Compare("adddefaultmap"))
		{
			// Same as above but adds to the existing definitions instead of replacing them completely
			ParseMapDefinition(defaultinfo);
		}
		else if (sc.Compare("map"))
		{
			level_info_t *levelinfo = ParseMapHeader(defaultinfo);

			ParseMapDefinition(*levelinfo);

			// When the second sky is -NOFLAT-, make it a copy of the first sky
			if (!levelinfo->SkyPic2.CompareNoCase("-NOFLAT-"))
			{
				levelinfo->SkyPic2 = levelinfo->SkyPic1;
			}
			SetLevelNum (levelinfo, levelinfo->levelnum);	// Wipe out matching levelnums from other maps.
		}
		// clusterdef is the old keyword but the new format has enough 
		// structuring that 'cluster' can be handled, too. The old format does not.
		else if (sc.Compare("clusterdef") || (format_type != FMT_Old && sc.Compare("cluster")))
		{
			ParseCluster();
		}
		else if (sc.Compare("episode"))
		{
			ParseEpisodeInfo();
		}
		else if (sc.Compare("clearepisodes"))
		{
			ClearEpisodes();
		}
		else if (sc.Compare("skill"))
		{
			ParseSkill();
		}
		else if (sc.Compare("clearskills"))
		{
			AllSkills.Clear();
			DefaultSkill = -1;
		}
		else if (sc.Compare("gameinfo"))
		{
			if (format_type != FMT_Old)
			{
				format_type = FMT_New;
				ParseGameInfo();
			}
			else
			{
				sc.ScriptError("gameinfo definitions not supported with old MAPINFO syntax");
			}
		}
		else if (sc.Compare("intermission"))
		{
			if (format_type != FMT_Old)
			{
				format_type = FMT_New;
				ParseIntermission();
			}
			else
			{
				sc.ScriptError("intermission definitions not supported with old MAPINFO syntax");
			}
		}
		else if (sc.Compare("doomednums"))
		{
			if (format_type != FMT_Old)
			{
				format_type = FMT_New;
				ParseDoomEdNums();
			}
			else
			{
				sc.ScriptError("doomednums definitions not supported with old MAPINFO syntax");
			}
		}
		else if (sc.Compare("spawnnums"))
		{
			if (format_type != FMT_Old)
			{
				format_type = FMT_New;
				ParseSpawnNums();
			}
			else
			{
				sc.ScriptError("spawnnums definitions not supported with old MAPINFO syntax");
			}
		}
		else if (sc.Compare("conversationids"))
		{
			if (format_type != FMT_Old)
			{
				format_type = FMT_New;
				ParseConversationIDs();
			}
			else
			{
				sc.ScriptError("conversationids definitions not supported with old MAPINFO syntax");
			}
		}
		else if (sc.Compare("automap") || sc.Compare("automap_overlay"))
		{
			if (format_type != FMT_Old)
			{
				format_type = FMT_New;
				ParseAMColors(sc.Compare("automap_overlay"));
			}
			else
			{
				sc.ScriptError("automap colorset definitions not supported with old MAPINFO syntax");
			}
		}
		else
		{
			sc.ScriptError("%s: Unknown top level keyword", sc.String);
		}
	}
}